

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::BindStaticResources
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderStages,
          IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  PipelineResourceSignatureImplType *this_00;
  string _msg;
  string local_40;
  
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature != false) {
    this_00 = GetResourceSignature(this,0);
    PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::BindStaticResources
              (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
               ShaderStages,pResourceMapping,Flags);
    return;
  }
  FormatString<char[165]>
            (&local_40,
             (char (*) [165])
             "IPipelineState::BindStaticResources is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::BindStaticResources instead."
            );
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(2,local_40._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BindStaticResources(SHADER_TYPE                 ShaderStages,
                                                        IResourceMapping*           pResourceMapping,
                                                        BIND_SHADER_RESOURCES_FLAGS Flags) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::BindStaticResources is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::BindStaticResources instead.");
            return;
        }

        return this->GetResourceSignature(0)->BindStaticResources(ShaderStages, pResourceMapping, Flags);
    }